

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_miner.cpp
# Opt level: O2

bool __thiscall
node::AncestorFeerateComparator::operator()
          (AncestorFeerateComparator *this,
          _Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *a,
          _Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *b)

{
  bool bVar1;
  strong_ordering sVar2;
  long in_FS_OFFSET;
  FeeFrac FVar3;
  FeeFrac FVar4;
  anon_class_1_0_00000001 local_51;
  FeeFrac local_50;
  FeeFrac local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  FVar3 = operator()<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
          ::anon_class_1_0_00000001::operator()(&local_51,(MiniMinerMempoolEntry *)(a->_M_node + 2))
  ;
  local_40.fee = FVar3.fee;
  local_40.size = FVar3.size;
  FVar4 = operator()<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
          ::anon_class_1_0_00000001::operator()(&local_51,(MiniMinerMempoolEntry *)(b->_M_node + 2))
  ;
  local_50.fee = FVar4.fee;
  local_50.size = FVar4.size;
  if (FVar3.fee == local_50.fee && FVar3.size == local_50.size) {
    bVar1 = ::operator<((base_blob<256U> *)(a->_M_node + 1),(base_blob<256U> *)(b->_M_node + 1));
  }
  else {
    sVar2 = operator<=>(&local_40,&local_50);
    bVar1 = '\0' < sVar2._M_value;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool operator()(const I& a, const I& b) const {
        auto min_feerate = [](const MiniMinerMempoolEntry& e) -> FeeFrac {
            FeeFrac self_feerate(e.GetModifiedFee(), e.GetTxSize());
            FeeFrac ancestor_feerate(e.GetModFeesWithAncestors(), e.GetSizeWithAncestors());
            return std::min(ancestor_feerate, self_feerate);
        };
        FeeFrac a_feerate{min_feerate(a->second)};
        FeeFrac b_feerate{min_feerate(b->second)};
        if (a_feerate != b_feerate) {
            return a_feerate > b_feerate;
        }
        // Use txid as tiebreaker for stable sorting
        return a->first < b->first;
    }